

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

int inv_weight(void)

{
  xchar xVar1;
  int iVar2;
  int ba_skill;
  int wt_diff;
  int wt;
  obj *otmp;
  
  ba_skill = 0;
  for (_wt_diff = invent; _wt_diff != (obj *)0x0; _wt_diff = _wt_diff->nobj) {
    if (_wt_diff->oclass == '\f') {
      ba_skill = (int)(((long)_wt_diff->quan + 0x32) / 100) + ba_skill;
    }
    else if ((_wt_diff->otyp != 0x214) || (((youmonst.data)->mflags2 & 0x8000000) == 0)) {
      if ((_wt_diff == uarm) && ((uint)objects[0x77].oc_weight < _wt_diff->owt)) {
        iVar2 = _wt_diff->owt - (uint)objects[0x77].oc_weight;
        xVar1 = mon_skill_level(0x28,&youmonst);
        ba_skill = (uint)objects[0x77].oc_weight + ba_skill;
        if (xVar1 < '\x02') {
          ba_skill = iVar2 + ba_skill;
        }
        else if (xVar1 == '\x02') {
          ba_skill = (iVar2 * 3) / 4 + ba_skill;
        }
        else if (xVar1 == '\x03') {
          ba_skill = iVar2 / 2 + ba_skill;
        }
        else if ('\x03' < xVar1) {
          ba_skill = iVar2 / 4 + ba_skill;
        }
      }
      else {
        ba_skill = _wt_diff->owt + ba_skill;
      }
    }
  }
  wc = weight_cap();
  return ba_skill - wc;
}

Assistant:

int inv_weight(void)
{
	struct obj *otmp = invent;
	int wt = 0;

	while (otmp) {
	    if (otmp->oclass == COIN_CLASS) {
		wt += (int)(((long)otmp->quan + 50L) / 100L);
	    } else if (otmp->otyp != BOULDER || !throws_rocks(youmonst.data)) {
		if (otmp == uarm && otmp->owt > P_BODY_ARMOR_MIN_WEIGHT) {
		    /*
		     * Reduce weight of worn body armor based on skill and
		     * weight difference from leather armor:
		     *
		     *  - unskilled -> no reduction
		     *  - basic     -> 25% reduction
		     *  - skilled   -> 50% reduction
		     *  - expert    -> 75% reduction
		     *
		     * e.g. Wearing plate mail {450} at expert only weighs {225}.
		     */
		    int wt_diff = otmp->owt - P_BODY_ARMOR_MIN_WEIGHT;
		    int ba_skill = mon_skill_level(P_BODY_ARMOR, &youmonst);
		    wt += P_BODY_ARMOR_MIN_WEIGHT;
		    if (ba_skill <= P_UNSKILLED)
			wt += wt_diff;
		    else if (ba_skill == P_BASIC)
			wt += wt_diff * 3 / 4;
		    else if (ba_skill == P_SKILLED)
			wt += wt_diff / 2;
		    else if (ba_skill >= P_EXPERT)
			wt += wt_diff / 4;
		} else {
		    wt += otmp->owt;
		}
	    }
	    otmp = otmp->nobj;
	}
	wc = weight_cap();
	return wt - wc;
}